

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

void __thiscall soul::StructuralParser::parseConnection(StructuralParser *this,Graph *graph)

{
  Allocator *pAVar1;
  UnqualifiedName *pUVar2;
  bool bVar3;
  Expression *pEVar4;
  pool_ref<soul::AST::Connection::SharedEndpoint> *ppVar5;
  DotOperator *pDVar6;
  char (*args) [53];
  long lVar7;
  pool_ref<soul::AST::Connection::SharedEndpoint> *source;
  pool_ref<soul::AST::Connection::SharedEndpoint> *args_2;
  pool_ref<soul::AST::Connection::SharedEndpoint> *dest;
  pool_ref<soul::AST::Connection::SharedEndpoint> *args_3;
  InterpolationType interpolationType;
  pool_ptr<soul::AST::DotOperator> dot;
  pool_ptr<soul::AST::Expression> delayLength;
  pool_ref<soul::AST::Expression> local_1a8;
  Context context;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL> dests;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL> sources;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  interpolationType = parseOptionalInterpolationType(this);
  getContext(&context,this);
  sources.items = (pool_ref<soul::AST::Connection::SharedEndpoint> *)sources.space;
  sources.numActive = 0;
  dests.items = (pool_ref<soul::AST::Connection::SharedEndpoint> *)dests.space;
  dests.numActive = 0;
  sources.numAllocated = 8;
  delayLength.object = (Expression *)0x0;
  dests.numAllocated = 8;
  do {
    pAVar1 = this->allocator;
    pEVar4 = parseExpression(this,false);
    dot.object = (DotOperator *)
                 PoolAllocator::
                 allocate<soul::AST::Connection::SharedEndpoint,soul::AST::Expression&>
                           (&pAVar1->pool,pEVar4);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::push_back
              (&sources,(pool_ref<soul::AST::Connection::SharedEndpoint> *)&dot);
    bVar3 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a3519);
  } while (bVar3);
  while( true ) {
    getContext((Context *)&dot,this);
    AST::Context::operator=(&context,(Context *)&dot);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr((RefCountedPtr<soul::SourceCodeText> *)&dot)
    ;
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a3701);
    parseDelayLength((StructuralParser *)&dot);
    delayLength.object = &(dot.object)->super_Expression;
    do {
      pAVar1 = this->allocator;
      pEVar4 = parseConnectionPoint(this);
      dot.object = (DotOperator *)
                   PoolAllocator::
                   allocate<soul::AST::Connection::SharedEndpoint,soul::AST::Expression&>
                             (&pAVar1->pool,pEVar4);
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::push_back
                (&dests,(pool_ref<soul::AST::Connection::SharedEndpoint> *)&dot);
      bVar3 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a3519);
    } while (bVar3);
    if ((1 < sources.numActive) && (1 < dests.numActive)) {
      Errors::notYetImplemented<char_const(&)[53]>
                (&local_68,(Errors *)"Many-to-many connections are not currently supported",args);
      AST::Context::throwError(&context,&local_68,false);
    }
    ppVar5 = sources.items + sources.numActive;
    for (args_2 = sources.items; args_2 != ppVar5; args_2 = args_2 + 1) {
      args_3 = dests.items;
      for (lVar7 = dests.numActive << 3; lVar7 != 0; lVar7 = lVar7 + -8) {
        dot.object = (DotOperator *)
                     allocate<soul::AST::Connection,soul::AST::Context&,soul::InterpolationType&,soul::pool_ref<soul::AST::Connection::SharedEndpoint>&,soul::pool_ref<soul::AST::Connection::SharedEndpoint>&,soul::pool_ptr<soul::AST::Expression>&>
                               (this,&context,&interpolationType,args_2,args_3,&delayLength);
        std::
        vector<soul::pool_ref<soul::AST::Connection>,std::allocator<soul::pool_ref<soul::AST::Connection>>>
        ::emplace_back<soul::pool_ref<soul::AST::Connection>>
                  ((vector<soul::pool_ref<soul::AST::Connection>,std::allocator<soul::pool_ref<soul::AST::Connection>>>
                    *)&graph->connections,(pool_ref<soul::AST::Connection> *)&dot);
        args_3 = args_3 + 1;
      }
    }
    bVar3 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)0x2a3701);
    if (!bVar3) break;
    if (dests.numActive != 1) {
      ppVar5 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::
               back(&dests);
      pEVar4 = (ppVar5->object->endpoint).object;
      Errors::cannotChainConnectionWithMultiple<>();
      AST::Context::throwError(&(pEVar4->super_Statement).super_ASTObject.context,&local_a0,false);
    }
    ppVar5 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::
             back(&dests);
    local_1a8.object = (ppVar5->object->endpoint).object;
    cast<soul::AST::DotOperator,soul::AST::Expression>((soul *)&dot,&local_1a8);
    if (dot.object != (DotOperator *)0x0) {
      pDVar6 = pool_ptr<soul::AST::DotOperator>::operator->(&dot);
      pUVar2 = pDVar6->rhs;
      Errors::cannotNameEndpointInChain<>();
      AST::Context::throwError
                (&(pUVar2->super_Expression).super_Statement.super_ASTObject.context,&local_d8,false
                );
    }
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::operator=
              (&sources,&dests);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::clear
              (&dests);
  }
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::clear(&dests);
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::clear
            (&sources);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&context);
  return;
}

Assistant:

void parseConnection (AST::Graph& graph)
    {
        auto interpolationType = parseOptionalInterpolationType();
        auto context = getContext();
        ArrayWithPreallocation<pool_ref<AST::Connection::SharedEndpoint>, 8> sources, dests;
        pool_ptr<AST::Expression> delayLength;

        for (;;)
        {
            sources.push_back (allocator.allocate<AST::Connection::SharedEndpoint> (parseExpression()));

            if (! matchIf (Operator::comma))
                break;
        }

        for (;;)
        {
            context = getContext();
            expect (Operator::rightArrow);
            delayLength = parseDelayLength();

            for (;;)
            {
                dests.push_back (allocator.allocate<AST::Connection::SharedEndpoint> (parseConnectionPoint()));

                if (! matchIf (Operator::comma))
                    break;
            }

            if (sources.size() > 1 && dests.size() > 1)
                context.throwError (Errors::notYetImplemented ("Many-to-many connections are not currently supported"));

            for (auto& source : sources)
                for (auto& dest : dests)
                    graph.connections.push_back (allocate<AST::Connection> (context, interpolationType, source, dest, delayLength));

            if (matches (Operator::rightArrow))
            {
                if (dests.size() != 1)
                    dests.back()->endpoint->context.throwError (Errors::cannotChainConnectionWithMultiple());

                if (auto dot = cast<AST::DotOperator> (dests.back()->endpoint))
                    dot->rhs.context.throwError (Errors::cannotNameEndpointInChain());

                sources = dests;
                dests.clear();
                continue;
            }

            break;
        }
    }